

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O0

bool r_exec::match(IPGMContext *input,IPGMContext *pattern,IPGMContext *productions,
                  vector<unsigned_short,_std::allocator<unsigned_short>_> *production_indices)

{
  bool bVar1;
  short sVar2;
  int iVar3;
  undefined1 local_178 [8];
  IPGMContext prod;
  uint16_t i;
  uint16_t production_index;
  uint16_t unused_index;
  uint16_t production_count;
  IPGMContext local_110;
  undefined4 local_dc;
  IPGMContext local_d8;
  IPGMContext local_a8;
  uint16_t local_62;
  undefined1 local_60 [6];
  uint16_t last_patch_index;
  IPGMContext skeleton;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *production_indices_local;
  IPGMContext *productions_local;
  IPGMContext *pattern_local;
  IPGMContext *input_local;
  
  skeleton.view = (View *)production_indices;
  IPGMContext::IPGMContext((IPGMContext *)local_60);
  IPGMContext::operator[](pattern,0);
  sVar2 = r_code::Atom::asOpcode();
  if (sVar2 == Opcodes::Ptn) {
    IPGMContext::getChild(&local_d8,pattern,1);
    IPGMContext::operator*(&local_a8,&local_d8);
    IPGMContext::operator=((IPGMContext *)local_60,&local_a8);
    IPGMContext::~IPGMContext(&local_a8);
    IPGMContext::~IPGMContext(&local_d8);
    bVar1 = IPGMContext::match((IPGMContext *)local_60,input);
    if (!bVar1) {
      input_local._7_1_ = false;
      goto LAB_0021339f;
    }
    local_62 = _Context::get_last_patch_index(&pattern->super__Context);
    bVar1 = match(input,pattern);
    if (!bVar1) {
      input_local._7_1_ = false;
      goto LAB_0021339f;
    }
  }
  else {
    IPGMContext::operator[](pattern,0);
    sVar2 = r_code::Atom::asOpcode();
    if (sVar2 != Opcodes::AntiPtn) {
      input_local._7_1_ = false;
      goto LAB_0021339f;
    }
    IPGMContext::getChild((IPGMContext *)&i,pattern,1);
    IPGMContext::operator*(&local_110,(IPGMContext *)&i);
    IPGMContext::operator=((IPGMContext *)local_60,&local_110);
    IPGMContext::~IPGMContext(&local_110);
    IPGMContext::~IPGMContext((IPGMContext *)&i);
    bVar1 = IPGMContext::match((IPGMContext *)local_60,input);
    if (bVar1) {
      input_local._7_1_ = false;
      goto LAB_0021339f;
    }
    local_62 = _Context::get_last_patch_index(&pattern->super__Context);
    bVar1 = match(input,pattern);
    if (bVar1) {
      input_local._7_1_ = false;
      goto LAB_0021339f;
    }
  }
  iVar3 = (*(productions->super__Context)._vptr__Context[6])();
  prod.view._6_2_ = (ushort)iVar3;
  for (prod.view._0_2_ = 1; (ushort)prod.view <= prod.view._6_2_;
      prod.view._0_2_ = (ushort)prod.view + 1) {
    IPGMContext::getChild((IPGMContext *)local_178,productions,(ushort)prod.view);
    IPGMContext::evaluate((IPGMContext *)local_178,(uint16_t *)((long)&prod.view + 4));
    IPGMContext::copy_to_value_array((IPGMContext *)local_178,(uint16_t *)((long)&prod.view + 2));
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)skeleton.view,
               (value_type_conflict *)((long)&prod.view + 2));
    IPGMContext::~IPGMContext((IPGMContext *)local_178);
  }
  _Context::unpatch_code(&pattern->super__Context,local_62);
  input_local._7_1_ = true;
LAB_0021339f:
  local_dc = 1;
  IPGMContext::~IPGMContext((IPGMContext *)local_60);
  return input_local._7_1_;
}

Assistant:

bool match(const IPGMContext &input, const IPGMContext &pattern, const IPGMContext &productions, std::vector<uint16_t> &production_indices)
{
    IPGMContext skeleton = IPGMContext();
    uint16_t last_patch_index;

    if (pattern[0].asOpcode() == Opcodes::Ptn) {
        skeleton = *pattern.getChild(1);

        if (!skeleton.match(input)) {
            return false;
        }

        last_patch_index = pattern.get_last_patch_index();

        if (!match(input, pattern)) {
            return false;
        }

        goto build_productions;
    }

    if (pattern[0].asOpcode() == Opcodes::AntiPtn) {
        skeleton = *pattern.getChild(1);

        if (skeleton.match(input)) {
            return false;
        }

        last_patch_index = pattern.get_last_patch_index();

        if (match(input, pattern)) {
            return false;
        }

        goto build_productions;
    }

    return false;
build_productions:
    // compute all productions for this input.
    uint16_t production_count = productions.getChildrenCount();
    uint16_t unused_index;
    uint16_t production_index;

    for (uint16_t i = 1; i <= production_count; ++i) {
        IPGMContext prod = productions.getChild(i);
        //prod.trace();
        prod.evaluate(unused_index);
        prod.copy_to_value_array(production_index);
        production_indices.push_back(production_index);
    }

    pattern.unpatch_code(last_patch_index);
    return true;
}